

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O1

void unbiasnet(nn_quant *nnq)

{
  int iVar1;
  long lVar2;
  nq_pixel *paiVar3;
  long lVar4;
  int iVar5;
  
  iVar1 = nnq->netsize;
  if (0 < (long)iVar1) {
    paiVar3 = nnq->network;
    lVar2 = 0;
    do {
      lVar4 = 0;
      do {
        iVar5 = (*paiVar3)[lVar4] + 8 >> 4;
        if (0xfe < iVar5) {
          iVar5 = 0xff;
        }
        (*paiVar3)[lVar4] = iVar5;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      nnq->network[lVar2][4] = (int)lVar2;
      lVar2 = lVar2 + 1;
      paiVar3 = paiVar3 + 1;
    } while (lVar2 != iVar1);
  }
  return;
}

Assistant:

void unbiasnet(nn_quant *nnq)
{
	int i,j,temp;

	for (i=0; i < nnq->netsize; i++) {
		for (j=0; j<4; j++) {
			/* OLD CODE: network[i][j] >>= netbiasshift; */
			/* Fix based on bug report by Juergen Weigert jw@suse.de */
			temp = (nnq->network[i][j] + (1 << (netbiasshift - 1))) >> netbiasshift;
			if (temp > 255) temp = 255;
			nnq->network[i][j] = temp;
		}
		nnq->network[i][4] = i;			/* record colour no */
	}
}